

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

void __thiscall OpenMD::NameFinder::loadNames(NameFinder *this)

{
  bool bVar1;
  element_type *peVar2;
  reference ppAVar3;
  TreeNodePtr atomNode_4;
  string atomName_4;
  iterator ai_4;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_3;
  TreeNodePtr inversionNode;
  string inversionName;
  TreeNodePtr atomNode_3;
  string atomName_3;
  iterator ai_3;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_2;
  TreeNodePtr torsionNode;
  string torsionName;
  TreeNodePtr atomNode_2;
  string atomName_2;
  iterator ai_2;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_1;
  TreeNodePtr bendNode;
  string bendName;
  TreeNodePtr atomNode_1;
  string atomName_1;
  iterator ai_1;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  TreeNodePtr bondNode;
  string bondName;
  TreeNodePtr rbNode;
  string rbName;
  TreeNodePtr atomNode;
  string atomName;
  TreeNodePtr molNode;
  string molName;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  MoleculeIterator mi;
  Molecule *in_stack_fffffffffffff9d8;
  reference in_stack_fffffffffffff9e0;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_fffffffffffff9f0;
  reference in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  int in_stack_fffffffffffffa04;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa28;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa30;
  Bond *in_stack_fffffffffffffac8;
  reference in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_430;
  string local_410 [32];
  Atom **local_3f0;
  Atom **local_3e8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_3e0;
  undefined1 local_3d8 [56];
  string local_3a0 [64];
  string local_360 [32];
  Atom **local_340;
  Atom **local_338;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_330;
  undefined1 local_328 [56];
  string local_2f0 [64];
  string local_2b0 [32];
  Atom **local_290;
  Atom **local_288;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_280;
  undefined1 local_278 [56];
  string local_240 [64];
  string local_200 [32];
  Atom **local_1e0;
  Atom **local_1d8;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_1d0;
  undefined1 local_1c8 [56];
  string local_190 [64];
  string local_150 [64];
  string local_110 [64];
  string local_d0 [88];
  Molecule *local_78;
  Torsion *local_70;
  Bend *local_68;
  Bond *local_60;
  RigidBody *local_58;
  Atom *local_50;
  Molecule *local_48;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_38;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_30;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_28;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_40);
  std::make_shared<OpenMD::TreeNode>();
  std::shared_ptr<OpenMD::TreeNode>::operator=
            ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
             (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
  std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ec5ed);
  std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2ec5fa);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
  SelectionSet::resize
            ((SelectionSet *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9f0);
  std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2ec65c);
  SelectionSet::setAll((SelectionSet *)in_stack_fffffffffffff9e0);
  local_48 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                        (MoleculeIterator *)in_stack_fffffffffffff9f8);
  while (local_48 != (Molecule *)0x0) {
    Molecule::getType_abi_cxx11_(in_stack_fffffffffffff9d8);
    std::shared_ptr<OpenMD::TreeNode>::shared_ptr
              ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
               (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
    createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ec709);
    peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ec716);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&(peVar2->bs).bitsets_,5);
    Molecule::getGlobalIndex(local_48);
    OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
    local_50 = Molecule::beginAtom((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                   (iterator *)in_stack_fffffffffffff9f8);
    while (local_50 != (Atom *)0x0) {
      (*(local_50->super_StuntDouble)._vptr_StuntDouble[7])(local_110);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
      createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ec808);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ec815);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,0);
      StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ec869);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,0);
      StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ec8bd);
      std::__cxx11::string::~string(local_110);
      local_50 = Molecule::nextAtom((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                    (iterator *)in_stack_fffffffffffff9f8);
    }
    local_58 = Molecule::beginRigidBody
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (iterator *)in_stack_fffffffffffff9f8);
    while (local_58 != (RigidBody *)0x0) {
      (*(local_58->super_StuntDouble)._vptr_StuntDouble[7])(local_150);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
      createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2eca63);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2eca70);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,0);
      StuntDouble::getGlobalIndex(&local_58->super_StuntDouble);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ecac4);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,0);
      StuntDouble::getGlobalIndex(&local_58->super_StuntDouble);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ecb18);
      std::__cxx11::string::~string(local_150);
      local_58 = Molecule::nextRigidBody
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                            (iterator *)in_stack_fffffffffffff9f8);
    }
    local_60 = Molecule::beginBond((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                   (iterator *)in_stack_fffffffffffff9f8);
    while (local_60 != (Bond *)0x0) {
      (*(local_60->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_190);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
      createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ecc59);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ecc66);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,1);
      ShortRangeInteraction::getGlobalIndex(&local_60->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2eccbb);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,1);
      ShortRangeInteraction::getGlobalIndex(&local_60->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      (*(local_60->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])(local_1c8);
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
      ::__normal_iterator(&local_1d0);
      local_1d8 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                                     ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                      in_stack_fffffffffffff9d8);
      local_1d0._M_current = local_1d8;
      while( true ) {
        local_1e0 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
                                       ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                        in_stack_fffffffffffff9d8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9d8);
        if (!bVar1) break;
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_1d0);
        (*((*ppAVar3)->super_StuntDouble)._vptr_StuntDouble[7])(local_200);
        std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                  ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                   (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
        createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ecdf7);
        peVar2 = std::
                 __shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ece04);
        in_stack_fffffffffffffad0 =
             std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                       (&(peVar2->bs).bitsets_,0);
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_1d0);
        in_stack_fffffffffffffadc = StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ece60);
        std::__cxx11::string::~string(local_200);
        __gnu_cxx::
        __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
        ::operator++(&local_1d0);
      }
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                (in_stack_fffffffffffff9f0);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ecf44);
      std::__cxx11::string::~string(local_190);
      in_stack_fffffffffffffac8 =
           Molecule::nextBond((Molecule *)
                              CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                              (iterator *)in_stack_fffffffffffff9f8);
      local_60 = in_stack_fffffffffffffac8;
    }
    local_68 = Molecule::beginBend((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                   (iterator *)in_stack_fffffffffffff9f8);
    while (local_68 != (Bend *)0x0) {
      (*(local_68->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_240);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
      createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed05b);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed068);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,2);
      ShortRangeInteraction::getGlobalIndex(&local_68->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed0bd);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,2);
      ShortRangeInteraction::getGlobalIndex(&local_68->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      (*(local_68->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])(local_278);
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
      ::__normal_iterator(&local_280);
      local_288 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                                     ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                      in_stack_fffffffffffff9d8);
      local_280._M_current = local_288;
      while( true ) {
        local_290 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
                                       ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                        in_stack_fffffffffffff9d8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9d8);
        if (!bVar1) break;
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_280);
        (*((*ppAVar3)->super_StuntDouble)._vptr_StuntDouble[7])(local_2b0);
        std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                  ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                   (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
        createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed1f9);
        peVar2 = std::
                 __shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed206);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                  (&(peVar2->bs).bitsets_,0);
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_280);
        StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed262);
        std::__cxx11::string::~string(local_2b0);
        __gnu_cxx::
        __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
        ::operator++(&local_280);
      }
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                (in_stack_fffffffffffff9f0);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed346);
      std::__cxx11::string::~string(local_240);
      local_68 = Molecule::nextBend((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                                    (iterator *)in_stack_fffffffffffff9f8);
    }
    local_70 = Molecule::beginTorsion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (iterator *)in_stack_fffffffffffff9f8);
    while (local_70 != (Torsion *)0x0) {
      (*(local_70->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[2])(local_2f0);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
      createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed45d);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed46a);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,3);
      ShortRangeInteraction::getGlobalIndex(&local_70->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed4bf);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,3);
      ShortRangeInteraction::getGlobalIndex(&local_70->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      (*(local_70->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[8])(local_328);
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
      ::__normal_iterator(&local_330);
      local_338 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                                     ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                      in_stack_fffffffffffff9d8);
      local_330._M_current = local_338;
      while( true ) {
        local_340 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
                                       ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                        in_stack_fffffffffffff9d8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9d8);
        if (!bVar1) break;
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_330);
        (*((*ppAVar3)->super_StuntDouble)._vptr_StuntDouble[7])(local_360);
        std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                  ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                   (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
        createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed5e9);
        peVar2 = std::
                 __shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed5f6);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                  (&(peVar2->bs).bitsets_,0);
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_330);
        StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed646);
        std::__cxx11::string::~string(local_360);
        __gnu_cxx::
        __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
        ::operator++(&local_330);
      }
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                (in_stack_fffffffffffff9f0);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed72a);
      std::__cxx11::string::~string(local_2f0);
      local_70 = Molecule::nextTorsion
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                            (iterator *)in_stack_fffffffffffff9f8);
    }
    local_78 = (Molecule *)
               Molecule::beginInversion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (iterator *)in_stack_fffffffffffff9f8);
    while (local_78 != (Molecule *)0x0) {
      (*((ShortRangeInteraction *)&local_78->_vptr_Molecule)->_vptr_ShortRangeInteraction[2])
                (local_3a0);
      std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                 (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
      createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed82f);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed83c);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&(peVar2->bs).bitsets_,4);
      ShortRangeInteraction::getGlobalIndex((ShortRangeInteraction *)local_78);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed885);
      in_stack_fffffffffffff9f8 =
           std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                     (&(peVar2->bs).bitsets_,4);
      in_stack_fffffffffffffa04 =
           ShortRangeInteraction::getGlobalIndex((ShortRangeInteraction *)local_78);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
      (*((ShortRangeInteraction *)&local_78->_vptr_Molecule)->_vptr_ShortRangeInteraction[8])
                (local_3d8);
      __gnu_cxx::
      __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
      ::__normal_iterator(&local_3e0);
      local_3e8 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin
                                     ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                      in_stack_fffffffffffff9d8);
      local_3e0._M_current = local_3e8;
      while( true ) {
        local_3f0 = (Atom **)std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end
                                       ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                                        in_stack_fffffffffffff9d8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                            *)in_stack_fffffffffffff9d8);
        if (!bVar1) break;
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_3e0);
        (*((*ppAVar3)->super_StuntDouble)._vptr_StuntDouble[7])(local_410);
        in_stack_fffffffffffff9f0 = &local_430;
        std::shared_ptr<OpenMD::TreeNode>::shared_ptr
                  ((shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9e0,
                   (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffff9d8);
        createNode((NameFinder *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                   (TreeNodePtr *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2ed9af);
        peVar2 = std::
                 __shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2ed9bc);
        in_stack_fffffffffffff9e0 =
             std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                       (&(peVar2->bs).bitsets_,0);
        ppAVar3 = __gnu_cxx::
                  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                  ::operator*(&local_3e0);
        StuntDouble::getGlobalIndex(&(*ppAVar3)->super_StuntDouble);
        OpenMDBitSet::setBitOn(in_stack_fffffffffffff9e0,(size_t)in_stack_fffffffffffff9d8);
        std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2eda0c);
        std::__cxx11::string::~string(local_410);
        __gnu_cxx::
        __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
        ::operator++(&local_3e0);
      }
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::~vector
                (in_stack_fffffffffffff9f0);
      std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2edaf0);
      std::__cxx11::string::~string(local_3a0);
      in_stack_fffffffffffff9d8 =
           (Molecule *)
           Molecule::nextInversion
                     ((Molecule *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                      (iterator *)in_stack_fffffffffffff9f8);
      local_78 = in_stack_fffffffffffff9d8;
    }
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x2edb5f);
    std::__cxx11::string::~string(local_d0);
    local_48 = SimInfo::nextMolecule
                         ((SimInfo *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                          (MoleculeIterator *)in_stack_fffffffffffff9f8);
  }
  return;
}

Assistant:

void NameFinder::loadNames() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    root_ = std::make_shared<TreeNode>();
    root_->bs.resize(nObjects_);
    root_->bs.setAll();  //

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      std::string molName = mol->getType();
      TreeNodePtr molNode = createNode(root_, molName);
      molNode->bs.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        std::string atomName = atom->getType();
        TreeNodePtr atomNode = createNode(molNode, atomName);

        molNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }

      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        std::string rbName = rb->getType();
        TreeNodePtr rbNode = createNode(molNode, rbName);

        molNode->bs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
        rbNode->bs.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());

        // COMMENTED OUT because rigid bodies are IntegrableObjects
        // (e.g. they are independently mobile, so selecting their
        // member atoms will give some odd results if we are computing
        // degrees of freedom elsewhere.

        // //create nodes for atoms belong to this rigidbody
        // for(atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai))
        // {
        //   std::string rbAtomName = atom->getType();
        //   TreeNodePtr rbAtomNode = createNode(rbNode, rbAtomName);

        //   rbAtomNode->bs.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        // }
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        std::string bondName = bond->getName();
        TreeNodePtr bondNode = createNode(molNode, bondName);

        molNode->bs.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
        bondNode->bs.bitsets_[BOND].setBitOn(bond->getGlobalIndex());

        std::vector<Atom*> atoms = bond->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(bondNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        std::string bendName = bend->getName();
        TreeNodePtr bendNode = createNode(molNode, bendName);

        molNode->bs.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
        bendNode->bs.bitsets_[BEND].setBitOn(bend->getGlobalIndex());

        std::vector<Atom*> atoms = bend->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(bendNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        std::string torsionName = torsion->getName();
        TreeNodePtr torsionNode = createNode(molNode, torsionName);

        molNode->bs.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
        torsionNode->bs.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());

        std::vector<Atom*> atoms = torsion->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(torsionNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        std::string inversionName = inversion->getName();
        TreeNodePtr inversionNode = createNode(molNode, inversionName);

        molNode->bs.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
        inversionNode->bs.bitsets_[INVERSION].setBitOn(
            inversion->getGlobalIndex());
        std::vector<Atom*> atoms = inversion->getAtoms();
        std::vector<Atom*>::iterator ai;

        for (ai = atoms.begin(); ai != atoms.end(); ++ai) {
          std::string atomName = (*ai)->getType();
          TreeNodePtr atomNode = createNode(inversionNode, atomName);
          atomNode->bs.bitsets_[STUNTDOUBLE].setBitOn((*ai)->getGlobalIndex());
        }
      }
    }
  }